

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O3

int __thiscall QNativeSocketEnginePrivate::option(QNativeSocketEnginePrivate *this,SocketOption opt)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  long in_FS_OFFSET;
  socklen_t len;
  int v;
  int level;
  int n;
  socklen_t local_30;
  uint local_2c;
  int local_28;
  int local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = (**(code **)(**(long **)&(this->super_QAbstractSocketEnginePrivate).field_0x8 + 0x78))();
  uVar3 = 0xffffffff;
  if ((cVar1 != '\0') && ((MaxStreamsSocketOption < opt || ((0x4023U >> (opt & 0x1f) & 1) == 0)))) {
    local_24 = -0x55555556;
    local_28 = -0x55555556;
    local_2c = 0;
    local_30 = 4;
    convertToLevelAndOption
              (opt,(this->super_QAbstractSocketEnginePrivate).socketProtocol,&local_28,&local_24);
    uVar3 = 0xffffffff;
    if ((local_24 != -1) &&
       ((iVar2 = getsockopt((int)this->socketDescriptor,local_28,local_24,&local_2c,&local_30),
        iVar2 != -1 && (uVar3 = local_2c, local_30 == 1)))) {
      uVar3 = local_2c & 0xff;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return uVar3;
}

Assistant:

int QNativeSocketEnginePrivate::option(QNativeSocketEngine::SocketOption opt) const
{
    Q_Q(const QNativeSocketEngine);
    if (!q->isValid())
        return -1;

    // handle non-getsockopt and specific cases first
    switch (opt) {
    case QNativeSocketEngine::BindExclusively:
    case QNativeSocketEngine::NonBlockingSocketOption:
    case QNativeSocketEngine::BroadcastSocketOption:
        return -1;
    case QNativeSocketEngine::MaxStreamsSocketOption: {
#ifndef QT_NO_SCTP
        sctp_initmsg sctpInitMsg;
        QT_SOCKOPTLEN_T sctpInitMsgSize = sizeof(sctpInitMsg);
        if (::getsockopt(socketDescriptor, SOL_SCTP, SCTP_INITMSG, &sctpInitMsg,
                         &sctpInitMsgSize) == 0)
            return int(qMin(sctpInitMsg.sinit_num_ostreams, sctpInitMsg.sinit_max_instreams));
#endif
        return -1;
    }

    case QNativeSocketEngine::PathMtuInformation:
#if defined(IPV6_PATHMTU) && !defined(IPV6_MTU)
        // Prefer IPV6_MTU (handled by convertToLevelAndOption), if available
        // (Linux); fall back to IPV6_PATHMTU otherwise (FreeBSD):
        if (socketProtocol == QAbstractSocket::IPv6Protocol) {
            ip6_mtuinfo mtuinfo;
            QT_SOCKOPTLEN_T len = sizeof(mtuinfo);
            if (::getsockopt(socketDescriptor, IPPROTO_IPV6, IPV6_PATHMTU, &mtuinfo, &len) == 0)
                return int(mtuinfo.ip6m_mtu);
            return -1;
        }
#endif
        break;

    default:
        break;
    }

    int n, level;
    int v = 0;
    QT_SOCKOPTLEN_T len = sizeof(v);

    convertToLevelAndOption(opt, socketProtocol, level, n);
    if (n != -1 && ::getsockopt(socketDescriptor, level, n, (char *) &v, &len) != -1)
        return len == 1 ? qFromUnaligned<quint8>(&v) : v;

    return -1;
}